

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.cc
# Opt level: O2

int PEM_def_callback(char *buf,int num,int w,void *key)

{
  size_t sVar1;
  int iVar2;
  
  iVar2 = -1;
  if (((-1 < num) && (buf != (char *)0x0)) && (key != (void *)0x0)) {
    sVar1 = strlen((char *)key);
    if (sVar1 < (uint)num) {
      OPENSSL_strlcpy(buf,(char *)key,(ulong)(uint)num);
      iVar2 = (int)sVar1;
    }
  }
  return iVar2;
}

Assistant:

int PEM_def_callback(char *buf, int size, int rwflag, void *userdata) {
  if (!buf || !userdata || size < 0) {
    return -1;
  }
  size_t len = strlen((char *)userdata);
  if (len >= (size_t)size) {
    return -1;
  }
  OPENSSL_strlcpy(buf, reinterpret_cast<char *>(userdata), (size_t)size);
  return (int)len;
}